

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphIterator.cpp
# Opt level: O0

bool __thiscall GlyphIterator::next(GlyphIterator *this)

{
  bool bVar1;
  GlyphIterator *this_local;
  
  this->pixel = this->pixel + 1;
  if (this->pixel < this->length) {
    this->xOffset = this->xOffset + 1;
    if (this->pixel % (uint)this->width == 0) {
      this->xOffset = (int)this->glyph->xOffset;
      this->yOffset = this->yOffset + 1;
    }
    bVar1 = getPixelValue(this,this->pixel);
    this->value = bVar1;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool GlyphIterator::next()
{
   this->pixel++;
   if (this->pixel >= this->length)
   {
      return 0; //end of glyph
   }

   //increment offsets
   this->xOffset++;
   if ((this->pixel % this->width) == 0) //wrap around?
   {
      this->xOffset = this->glyph->xOffset;
      this->yOffset++;
   }

   //get new pixel value
   this->value = getPixelValue(this->pixel);
   return 1;
}